

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::ReadString(SQLexer *this,SQInteger ndelim,bool verbatim)

{
  int iVar1;
  ulong uVar2;
  SQUnsignedInteger SVar3;
  long lVar4;
  char *pcVar5;
  byte in_DL;
  ulong in_RSI;
  sqvector<char> *in_RDI;
  SQInteger len;
  SQChar *stemp_1;
  SQChar temp_1 [9];
  SQInteger maxdigits_1;
  SQChar *stemp;
  SQChar temp [3];
  SQInteger maxdigits;
  SQInteger x;
  SQUnsignedInteger *in_stack_ffffffffffffff58;
  SQLexer *in_stack_ffffffffffffff60;
  SQUnsignedInteger in_stack_ffffffffffffff68;
  SQLexer *in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff82;
  undefined1 in_stack_ffffffffffffff83;
  undefined1 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  char *local_70;
  char local_61 [9];
  long local_58;
  undefined1 local_49;
  char *local_48;
  char local_3b [3];
  undefined8 local_38;
  undefined1 local_2a;
  undefined1 local_29;
  ulong local_28;
  undefined1 local_1a;
  byte local_19;
  ulong local_18;
  SQInteger local_8;
  
  local_19 = in_DL & 1;
  local_1a = 0;
  local_18 = in_RSI;
  sqvector<char>::resize(in_RDI,in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60);
  Next(in_stack_ffffffffffffff60);
  in_RDI[2]._vals = in_RDI[2]._vals + 1;
  if (*(char *)&in_RDI[4]._vals == '\0') {
    local_8 = -1;
  }
  else {
    while( true ) {
      while (*(byte *)&in_RDI[4]._vals != local_18) {
        local_28 = (ulong)*(byte *)&in_RDI[4]._vals;
        if (local_28 == 0) {
          Error(in_stack_ffffffffffffff60,(SQChar *)in_stack_ffffffffffffff58);
          return -1;
        }
        if (local_28 == 10) {
          if ((local_19 & 1) == 0) {
            Error(in_stack_ffffffffffffff60,(SQChar *)in_stack_ffffffffffffff58);
          }
          local_29 = *(undefined1 *)&in_RDI[4]._vals;
          sqvector<char>::push_back
                    ((sqvector<char> *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
          Next(in_stack_ffffffffffffff60);
          in_RDI[2]._vals = in_RDI[2]._vals + 1;
          in_RDI[1]._size = in_RDI[1]._size + 1;
        }
        else if (local_28 == 0x5c) {
          if ((local_19 & 1) == 0) {
            Next(in_stack_ffffffffffffff60);
            in_RDI[2]._vals = in_RDI[2]._vals + 1;
            in_stack_ffffffffffffff60 = (SQLexer *)(ulong)(*(byte *)&in_RDI[4]._vals - 0x22);
            switch(in_stack_ffffffffffffff60) {
            case (SQLexer *)0x0:
              in_stack_ffffffffffffff86 = 0x22;
              sqvector<char>::push_back
                        ((sqvector<char> *)in_stack_ffffffffffffff60,
                         (char *)in_stack_ffffffffffffff58);
              Next(in_stack_ffffffffffffff60);
              in_RDI[2]._vals = in_RDI[2]._vals + 1;
              break;
            default:
              Error(in_stack_ffffffffffffff60,(SQChar *)in_stack_ffffffffffffff58);
              break;
            case (SQLexer *)0x5:
              in_stack_ffffffffffffff85 = 0x27;
              sqvector<char>::push_back
                        ((sqvector<char> *)in_stack_ffffffffffffff60,
                         (char *)in_stack_ffffffffffffff58);
              Next(in_stack_ffffffffffffff60);
              in_RDI[2]._vals = in_RDI[2]._vals + 1;
              break;
            case (SQLexer *)0xe:
              sqvector<char>::push_back
                        ((sqvector<char> *)in_stack_ffffffffffffff60,
                         (char *)in_stack_ffffffffffffff58);
              Next(in_stack_ffffffffffffff60);
              in_RDI[2]._vals = in_RDI[2]._vals + 1;
              break;
            case (SQLexer *)0x33:
            case (SQLexer *)0x53:
              iVar1 = 8;
              if (*(char *)&in_RDI[4]._vals == 'u') {
                iVar1 = 4;
              }
              local_58 = (long)iVar1;
              ProcessStringHexEscape
                        ((SQLexer *)
                         CONCAT17(in_stack_ffffffffffffff87,
                                  CONCAT16(in_stack_ffffffffffffff86,
                                           CONCAT15(in_stack_ffffffffffffff85,
                                                    CONCAT14(in_stack_ffffffffffffff84,
                                                             CONCAT13(in_stack_ffffffffffffff83,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffff82,
                                                  in_stack_ffffffffffffff80)))))),
                         (SQChar *)in_stack_ffffffffffffff78,(SQInteger)in_RDI);
              strtoul(local_61,&local_70,0x10);
              AddUTF8(in_stack_ffffffffffffff78,(SQUnsignedInteger)in_RDI);
              break;
            case (SQLexer *)0x3a:
              in_stack_ffffffffffffff87 = 0x5c;
              sqvector<char>::push_back
                        ((sqvector<char> *)in_stack_ffffffffffffff60,
                         (char *)in_stack_ffffffffffffff58);
              Next(in_stack_ffffffffffffff60);
              in_RDI[2]._vals = in_RDI[2]._vals + 1;
              break;
            case (SQLexer *)0x3f:
              sqvector<char>::push_back
                        ((sqvector<char> *)in_stack_ffffffffffffff60,
                         (char *)in_stack_ffffffffffffff58);
              Next(in_stack_ffffffffffffff60);
              in_RDI[2]._vals = in_RDI[2]._vals + 1;
              break;
            case (SQLexer *)0x40:
              sqvector<char>::push_back
                        ((sqvector<char> *)in_stack_ffffffffffffff60,
                         (char *)in_stack_ffffffffffffff58);
              Next(in_stack_ffffffffffffff60);
              in_RDI[2]._vals = in_RDI[2]._vals + 1;
              break;
            case (SQLexer *)0x44:
              sqvector<char>::push_back
                        ((sqvector<char> *)in_stack_ffffffffffffff60,
                         (char *)in_stack_ffffffffffffff58);
              Next(in_stack_ffffffffffffff60);
              in_RDI[2]._vals = in_RDI[2]._vals + 1;
              break;
            case (SQLexer *)0x4c:
              sqvector<char>::push_back
                        ((sqvector<char> *)in_stack_ffffffffffffff60,
                         (char *)in_stack_ffffffffffffff58);
              Next(in_stack_ffffffffffffff60);
              in_RDI[2]._vals = in_RDI[2]._vals + 1;
              break;
            case (SQLexer *)0x50:
              sqvector<char>::push_back
                        ((sqvector<char> *)in_stack_ffffffffffffff60,
                         (char *)in_stack_ffffffffffffff58);
              Next(in_stack_ffffffffffffff60);
              in_RDI[2]._vals = in_RDI[2]._vals + 1;
              break;
            case (SQLexer *)0x52:
              sqvector<char>::push_back
                        ((sqvector<char> *)in_stack_ffffffffffffff60,
                         (char *)in_stack_ffffffffffffff58);
              Next(in_stack_ffffffffffffff60);
              in_RDI[2]._vals = in_RDI[2]._vals + 1;
              break;
            case (SQLexer *)0x54:
              sqvector<char>::push_back
                        ((sqvector<char> *)in_stack_ffffffffffffff60,
                         (char *)in_stack_ffffffffffffff58);
              Next(in_stack_ffffffffffffff60);
              in_RDI[2]._vals = in_RDI[2]._vals + 1;
              break;
            case (SQLexer *)0x56:
              local_38 = 2;
              ProcessStringHexEscape
                        ((SQLexer *)
                         CONCAT17(in_stack_ffffffffffffff87,
                                  CONCAT16(in_stack_ffffffffffffff86,
                                           CONCAT15(in_stack_ffffffffffffff85,
                                                    CONCAT14(in_stack_ffffffffffffff84,
                                                             CONCAT13(in_stack_ffffffffffffff83,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffff82,
                                                  in_stack_ffffffffffffff80)))))),
                         (SQChar *)in_stack_ffffffffffffff78,(SQInteger)in_RDI);
              in_stack_ffffffffffffff58 = &in_RDI[4]._allocated;
              uVar2 = strtoul(local_3b,&local_48,0x10);
              local_49 = (undefined1)uVar2;
              sqvector<char>::push_back
                        ((sqvector<char> *)in_stack_ffffffffffffff60,
                         (char *)in_stack_ffffffffffffff58);
            }
          }
          else {
            local_2a = 0x5c;
            sqvector<char>::push_back
                      ((sqvector<char> *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58
                      );
            Next(in_stack_ffffffffffffff60);
            in_RDI[2]._vals = in_RDI[2]._vals + 1;
          }
        }
        else {
          in_stack_ffffffffffffff84 = *(undefined1 *)&in_RDI[4]._vals;
          sqvector<char>::push_back
                    ((sqvector<char> *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
          Next(in_stack_ffffffffffffff60);
          in_RDI[2]._vals = in_RDI[2]._vals + 1;
        }
      }
      Next(in_stack_ffffffffffffff60);
      in_RDI[2]._vals = in_RDI[2]._vals + 1;
      if (((local_19 & 1) == 0) || (*(char *)&in_RDI[4]._vals != '\"')) break;
      in_stack_ffffffffffffff83 = *(undefined1 *)&in_RDI[4]._vals;
      sqvector<char>::push_back
                ((sqvector<char> *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
      Next(in_stack_ffffffffffffff60);
      in_RDI[2]._vals = in_RDI[2]._vals + 1;
    }
    sqvector<char>::push_back
              ((sqvector<char> *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    SVar3 = sqvector<char>::size((sqvector<char> *)&in_RDI[4]._allocated);
    lVar4 = SVar3 - 1;
    if (local_18 == 0x27) {
      if (lVar4 == 0) {
        Error(in_stack_ffffffffffffff60,(SQChar *)in_stack_ffffffffffffff58);
      }
      if (1 < lVar4) {
        Error(in_stack_ffffffffffffff60,(SQChar *)in_stack_ffffffffffffff58);
      }
      pcVar5 = sqvector<char>::operator[]((sqvector<char> *)&in_RDI[4]._allocated,0);
      in_RDI[2]._allocated = (long)*pcVar5;
      local_8 = 0x104;
    }
    else {
      pcVar5 = sqvector<char>::operator[]((sqvector<char> *)&in_RDI[4]._allocated,0);
      in_RDI[2]._size = (SQUnsignedInteger)pcVar5;
      local_8 = 0x103;
    }
  }
  return local_8;
}

Assistant:

SQInteger SQLexer::ReadString(SQInteger ndelim,bool verbatim)
{
    INIT_TEMP_STRING();
    NEXT();
    if(IS_EOB()) return -1;
    for(;;) {
        while(CUR_CHAR != ndelim) {
            SQInteger x = CUR_CHAR;
            switch (x) {
            case SQUIRREL_EOB:
                Error(_SC("unfinished string"));
                return -1;
            case _SC('\n'):
                if(!verbatim) Error(_SC("newline in a constant"));
                APPEND_CHAR(CUR_CHAR); NEXT();
                _currentline++;
                break;
            case _SC('\\'):
                if(verbatim) {
                    APPEND_CHAR('\\'); NEXT();
                }
                else {
                    NEXT();
                    switch(CUR_CHAR) {
                    case _SC('x'):  {
                        const SQInteger maxdigits = sizeof(SQChar) * 2;
                        SQChar temp[maxdigits + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
                        APPEND_CHAR((SQChar)scstrtoul(temp, &stemp, 16));
                    }
                    break;
                    case _SC('U'):
                    case _SC('u'):  {
                        const SQInteger maxdigits = CUR_CHAR == 'u' ? 4 : 8;
                        SQChar temp[8 + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
#ifdef SQUNICODE
#if WCHAR_SIZE == 2
                        AddUTF16(scstrtoul(temp, &stemp, 16));
#else
                        APPEND_CHAR((SQChar)scstrtoul(temp, &stemp, 16));
#endif
#else
                        AddUTF8(scstrtoul(temp, &stemp, 16));
#endif
                    }
                    break;
                    case _SC('t'): APPEND_CHAR(_SC('\t')); NEXT(); break;
                    case _SC('a'): APPEND_CHAR(_SC('\a')); NEXT(); break;
                    case _SC('b'): APPEND_CHAR(_SC('\b')); NEXT(); break;
                    case _SC('n'): APPEND_CHAR(_SC('\n')); NEXT(); break;
                    case _SC('r'): APPEND_CHAR(_SC('\r')); NEXT(); break;
                    case _SC('v'): APPEND_CHAR(_SC('\v')); NEXT(); break;
                    case _SC('f'): APPEND_CHAR(_SC('\f')); NEXT(); break;
                    case _SC('0'): APPEND_CHAR(_SC('\0')); NEXT(); break;
                    case _SC('\\'): APPEND_CHAR(_SC('\\')); NEXT(); break;
                    case _SC('"'): APPEND_CHAR(_SC('"')); NEXT(); break;
                    case _SC('\''): APPEND_CHAR(_SC('\'')); NEXT(); break;
                    default:
                        Error(_SC("unrecognised escaper char"));
                    break;
                    }
                }
                break;
            default:
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
        }
        NEXT();
        if(verbatim && CUR_CHAR == '"') { //double quotation
            APPEND_CHAR(CUR_CHAR);
            NEXT();
        }
        else {
            break;
        }
    }
    TERMINATE_BUFFER();
    SQInteger len = _longstr.size()-1;
    if(ndelim == _SC('\'')) {
        if(len == 0) Error(_SC("empty constant"));
        if(len > 1) Error(_SC("constant too long"));
        _nvalue = _longstr[0];
        return TK_INTEGER;
    }
    _svalue = &_longstr[0];
    return TK_STRING_LITERAL;
}